

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_join_ti_impl.h
# Opt level: O3

void __thiscall
join::
TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::upperbound(TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
             *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                   *trees_collection,
            vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
            vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result,
            double distance_threshold)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer __args;
  __node_base_ptr *pp_Var3;
  double ub_value;
  AlgsCostModel cm;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> lgm_algorithm;
  TreeIndexLGM ti_1;
  TreeIndexLGM ti_2;
  double local_278;
  UnitCostModelLD<label::StringLabel> local_270;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> local_268;
  TreeIndexLGM local_1e0;
  TreeIndexLGM local_108;
  
  local_268.super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>.
  c_ = &local_270;
  local_268.super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>.
  _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_0012ebe0;
  local_268.t2_label_il_start_pos_._M_h._M_buckets =
       &local_268.t2_label_il_start_pos_._M_h._M_single_bucket;
  local_268.t2_label_il_start_pos_._M_h._M_bucket_count = 1;
  local_268.t2_label_il_start_pos_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_268.t2_label_il_start_pos_._M_h._M_element_count = 0;
  local_268.t2_label_il_start_pos_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_268.t2_label_il_start_pos_._M_h._M_rehash_policy._M_next_resize = 0;
  local_268.t2_label_il_start_pos_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_268.t2_label_il_._M_h._M_buckets = &local_268.t2_label_il_._M_h._M_single_bucket;
  local_268.t2_label_il_._M_h._M_bucket_count = 1;
  local_268.t2_label_il_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_268.t2_label_il_._M_h._M_element_count = 0;
  local_268.t2_label_il_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_268.t2_label_il_._M_h._M_rehash_policy._M_next_resize = 0;
  local_268.t2_label_il_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_270.ld_ = &this->ld_;
  memset(&local_1e0.super_PostLToLabelId,0,0x90);
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count =
       1;
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count
       = 0;
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket
       = (__node_base_ptr)0x0;
  pp_Var3 = &local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
             _M_single_bucket;
  local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
       &local_1e0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
        _M_single_bucket;
  memset(&local_108.super_PostLToLabelId,0,0x90);
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count =
       1;
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_element_count
       = 0;
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_single_bucket
       = (__node_base_ptr)0x0;
  __args = (candidates->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_108.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
       pp_Var3;
  if (__args != (candidates->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      node::
      index_tree<node::TreeIndexLGM,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                (&local_1e0,
                 (trees_collection->
                 super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + __args->first,&this->ld_,&local_270);
      node::
      index_tree<node::TreeIndexLGM,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                (&local_108,
                 (trees_collection->
                 super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + __args->second,&this->ld_,&local_270);
      local_278 = ted_ub::
                  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
                  ::ted_k(&local_268,&local_1e0,&local_108,(int)distance_threshold);
      if (local_278 <= distance_threshold) {
        std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>::
        emplace_back<int&,int&,double&>
                  ((vector<join::JoinResultElement,std::allocator<join::JoinResultElement>> *)
                   join_result,&__args->first,&__args->second,&local_278);
        ppVar1 = (candidates->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        ppVar2 = ppVar1 + -1;
        *__args = ppVar1[-1];
        (candidates->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      else {
        __args = __args + 1;
        ppVar2 = (candidates->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
    } while (__args != ppVar2);
  }
  node::TreeIndexLGM::~TreeIndexLGM(&local_108);
  node::TreeIndexLGM::~TreeIndexLGM(&local_1e0);
  local_268.super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>.
  _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_0012ebe0;
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_268.t2_label_il_._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_268.t2_label_il_start_pos_._M_h);
  return;
}

Assistant:

void TJoinTI<Label, VerificationAlgorithm>::upperbound(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {
  
  typename VerificationAlgorithm::AlgsCostModel cm(ld_);
  ted_ub::LGMTreeIndex<typename VerificationAlgorithm::AlgsCostModel> lgm_algorithm(cm);
  // TODO: Index trees only once for LGM And Verification using a TreeIndex
  //       that is a superset of TreeIndexLGM and VerificationAlgorithm::AlgsTreeIndex.
  node::TreeIndexLGM ti_1;
  node::TreeIndexLGM ti_2;
  
  std::vector<std::pair<int, int>>::iterator it = candidates.begin();
  while(it != candidates.end()) {
    node::index_tree(ti_1, trees_collection[it->first], ld_, cm);
    node::index_tree(ti_2, trees_collection[it->second], ld_, cm);
    double ub_value = lgm_algorithm.ted_k(ti_1, ti_2, distance_threshold);
    if(ub_value <= distance_threshold) {
      join_result.emplace_back(it->first, it->second, ub_value);
      *it = candidates.back();
      candidates.pop_back();
    }
    else {
      ++it;
    }
  }
}